

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_indices_encoding_observer.h
# Opt level: O0

void __thiscall
draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::OnNewVertexVisited
          (MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> *this,
          VertexIndex vertex,CornerIndex corner)

{
  uint uVar1;
  Face *this_00;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar3;
  long in_RDI;
  PointIndex point_id;
  Mesh *this_02;
  undefined8 in_stack_ffffffffffffffc0;
  FaceIndex face_id;
  value_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  value_type vVar4;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_18;
  uint local_14;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_4;
  
  face_id.value_ = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  this_02 = *(Mesh **)(in_RDI + 0x10);
  uVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_8);
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_18,uVar1 / 3);
  this_00 = Mesh::face(this_02,face_id);
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_8);
  pvVar2 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                     (this_00,(size_type)this_02);
  local_14 = pvVar2->value_;
  PointsSequencer::AddPointId((PointsSequencer *)this_02,(PointIndex)(uint)((ulong)this_00 >> 0x20))
  ;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::push_back((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8);
  vVar4 = *(value_type *)(*(long *)(in_RDI + 8) + 0x30);
  this_01 = (vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 8) + 0x18);
  uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_4);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(ulong)uVar1);
  *pvVar3 = vVar4;
  *(int *)(*(long *)(in_RDI + 8) + 0x30) = *(int *)(*(long *)(in_RDI + 8) + 0x30) + 1;
  return;
}

Assistant:

inline void OnNewVertexVisited(VertexIndex vertex, CornerIndex corner) {
    const PointIndex point_id =
        mesh_->face(FaceIndex(corner.value() / 3))[corner.value() % 3];
    // Append the visited attribute to the encoding order.
    sequencer_->AddPointId(point_id);

    // Keep track of visited corners.
    encoding_data_->encoded_attribute_value_index_to_corner_map.push_back(
        corner);

    encoding_data_
        ->vertex_to_encoded_attribute_value_index_map[vertex.value()] =
        encoding_data_->num_values;

    encoding_data_->num_values++;
  }